

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<Implicit_const&>::operator==
          (result *__return_storage_ptr__,expression_lhs<Implicit_const&> *this,Implicit *rhs)

{
  lest *this_00;
  Implicit *in_R8;
  allocator<char> local_71;
  Implicit local_70 [8];
  string local_50;
  int local_2c;
  int local_28;
  bool local_21;
  string *local_20;
  Implicit *rhs_local;
  expression_lhs<const_Implicit_&> *this_local;
  
  local_28 = **(int **)this;
  local_2c = rhs->x;
  local_20 = (string *)rhs;
  rhs_local = (Implicit *)this;
  this_local = (expression_lhs<const_Implicit_&> *)__return_storage_ptr__;
  local_21 = ::operator==((Implicit)local_28,(Implicit)local_2c);
  this_00 = *(lest **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"==",&local_71);
  to_string<Implicit,Implicit>(&local_50,this_00,local_70,local_20,in_R8);
  result::result<bool>(__return_storage_ptr__,&local_21,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)local_70);
  std::allocator<char>::~allocator(&local_71);
  return __return_storage_ptr__;
}

Assistant:

result operator< ( R const & rhs ) { return result{ lhs <  rhs, to_string( lhs, "<" , rhs ) }; }